

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITexec.cpp
# Opt level: O2

bool get_jit_file(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ifstream in;
  
  this = &bStack_278;
  std::ifstream::ifstream(&in);
  bVar1 = std::operator==(&Directory_abi_cxx11_,"");
  if (bVar1) {
    std::operator+(&bStack_278,&FileName_abi_cxx11_,".jit");
    std::ifstream::open((string *)&in,(_Ios_Openmode)&bStack_278);
  }
  else {
    std::operator+(&local_258,&Directory_abi_cxx11_,"\\");
    std::operator+(&local_238,&local_258,&FileName_abi_cxx11_);
    std::operator+(&bStack_278,&local_238,".jit");
    std::ifstream::open((string *)&in,(_Ios_Openmode)&bStack_278);
    std::__cxx11::string::~string((string *)&bStack_278);
    std::__cxx11::string::~string((string *)&local_238);
    this = &local_258;
  }
  std::__cxx11::string::~string((string *)this);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    bVar1 = false;
  }
  else {
    std::istream::seekg((long)&in,_S_beg);
    iVar3 = std::istream::tellg();
    pvVar4 = operator_new__((long)iVar3);
    std::istream::seekg((long)&in,_S_beg);
    std::istream::read((char *)&in,(long)pvVar4);
    std::ifstream::close();
    len = *(uint *)((long)pvVar4 + 3);
    code_index = *(uint *)((long)pvVar4 + 7);
    jit_type = *(char *)((long)pvVar4 + 0xb);
    code_bin_end = *(uint *)((long)pvVar4 + 0xc);
    shellcode_begin = (char *)((long)pvVar4 + 0x10);
    bVar1 = code_index == registe_ptr->IP;
  }
  std::ifstream::~ifstream(&in);
  return bVar1;
}

Assistant:

bool get_jit_file() {
	char *shcode_origin;
	std::ifstream in;
	if(Directory=="") in.open( FileName + ".jit", std::ifstream::in);
	else in.open(Directory+"\\"+FileName+".jit", std::ifstream::in);
	if (in.is_open()) {
		in.seekg(0, std::ios::end);//移到文件尾部
		int shcode_size = in.tellg();//获取文件大小
		shcode_origin = new char[shcode_size];
		in.seekg(0, std::ios::beg);//移到文件头部
		in.read(shcode_origin, shcode_size);
		in.close();
		len = *(unsigned*)(shcode_origin + 3);
		code_index = *(unsigned*)(shcode_origin + 7);
		jit_type = *(shcode_origin + 11);
		code_bin_end= *(unsigned*)(shcode_origin + 12);
		shellcode_begin = shcode_origin + 16;
		if(code_index==registe_ptr->IP)return true;
		else return false;
	}
	else return false;
}